

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcphuff.c
# Opt level: O2

void finish_pass_gather_phuff(j_compress_ptr cinfo)

{
  int iVar1;
  phuff_entropy_ptr entropy;
  ulong uVar2;
  JHUFF_TBL *htbl;
  long lVar3;
  long lVar4;
  long lStack_60;
  boolean did [4];
  
  entropy = (phuff_entropy_ptr)cinfo->entropy;
  emit_eobrun(entropy);
  iVar1 = cinfo->Ss;
  did[0] = 0;
  did[1] = 0;
  did[2] = 0;
  did[3] = 0;
  uVar2 = (ulong)(iVar1 != 0);
  lVar3 = 0;
  do {
    if (cinfo->comps_in_scan <= lVar3) {
      return;
    }
    lStack_60 = 0x18;
    if (iVar1 == 0) {
      lStack_60 = 0x14;
      if (cinfo->Ah == 0) goto LAB_0011c13f;
    }
    else {
LAB_0011c13f:
      lVar4 = (long)*(int *)((long)&cinfo->cur_comp_info[lVar3]->component_id + lStack_60);
      if (did[lVar4] == 0) {
        htbl = cinfo->dc_huff_tbl_ptrs[uVar2 * 4 + lVar4];
        if (htbl == (JHUFF_TBL *)0x0) {
          htbl = jpeg_alloc_huff_table((j_common_ptr)cinfo);
          cinfo->dc_huff_tbl_ptrs[uVar2 * 4 + lVar4] = htbl;
        }
        jpeg_gen_optimal_table(cinfo,htbl,entropy->count_ptrs[lVar4]);
        did[lVar4] = 1;
      }
    }
    lVar3 = lVar3 + 1;
  } while( true );
}

Assistant:

METHODDEF(void)
finish_pass_gather_phuff(j_compress_ptr cinfo)
{
  phuff_entropy_ptr entropy = (phuff_entropy_ptr)cinfo->entropy;
  boolean is_DC_band;
  int ci, tbl;
  jpeg_component_info *compptr;
  JHUFF_TBL **htblptr;
  boolean did[NUM_HUFF_TBLS];

  /* Flush out buffered data (all we care about is counting the EOB symbol) */
  emit_eobrun(entropy);

  is_DC_band = (cinfo->Ss == 0);

  /* It's important not to apply jpeg_gen_optimal_table more than once
   * per table, because it clobbers the input frequency counts!
   */
  MEMZERO(did, sizeof(did));

  for (ci = 0; ci < cinfo->comps_in_scan; ci++) {
    compptr = cinfo->cur_comp_info[ci];
    if (is_DC_band) {
      if (cinfo->Ah != 0)       /* DC refinement needs no table */
        continue;
      tbl = compptr->dc_tbl_no;
    } else {
      tbl = compptr->ac_tbl_no;
    }
    if (!did[tbl]) {
      if (is_DC_band)
        htblptr = &cinfo->dc_huff_tbl_ptrs[tbl];
      else
        htblptr = &cinfo->ac_huff_tbl_ptrs[tbl];
      if (*htblptr == NULL)
        *htblptr = jpeg_alloc_huff_table((j_common_ptr)cinfo);
      jpeg_gen_optimal_table(cinfo, *htblptr, entropy->count_ptrs[tbl]);
      did[tbl] = TRUE;
    }
  }
}